

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O0

void __thiscall
llvm::sys::fs::basic_file_status::basic_file_status(basic_file_status *this,file_type Type)

{
  file_type Type_local;
  basic_file_status *this_local;
  
  this->fs_st_atime = 0;
  this->fs_st_mtime = 0;
  this->fs_st_atime_nsec = 0;
  this->fs_st_mtime_nsec = 0;
  this->fs_st_uid = 0;
  this->fs_st_gid = 0;
  this->fs_st_size = 0;
  this->Type = Type;
  this->Perms = perms_not_known;
  return;
}

Assistant:

explicit basic_file_status(file_type Type) : Type(Type) {}